

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O1

ssh_key * dsa_new_pub(ssh_keyalg *self,ptrlen data)

{
  _Bool _Var1;
  uint uVar2;
  undefined8 *puVar3;
  mp_int *pmVar4;
  ptrlen pl;
  BinarySource src [1];
  BinarySource local_38;
  
  local_38.len = data.len;
  local_38.data = data.ptr;
  local_38.binarysource_ = &local_38;
  local_38.pos = 0;
  local_38.err = BSE_NO_ERROR;
  pl = BinarySource_get_string(&local_38);
  _Var1 = ptrlen_eq_string(pl,"ssh-dss");
  if (_Var1) {
    puVar3 = (undefined8 *)safemalloc(1,0x30,0);
    puVar3[5] = &ssh_dsa;
    pmVar4 = BinarySource_get_mp_ssh2(local_38.binarysource_);
    *puVar3 = pmVar4;
    pmVar4 = BinarySource_get_mp_ssh2(local_38.binarysource_);
    puVar3[1] = pmVar4;
    pmVar4 = BinarySource_get_mp_ssh2(local_38.binarysource_);
    puVar3[2] = pmVar4;
    pmVar4 = BinarySource_get_mp_ssh2(local_38.binarysource_);
    puVar3[3] = pmVar4;
    puVar3[4] = 0;
    if ((((local_38.binarysource_)->err == BSE_NO_ERROR) &&
        (uVar2 = mp_eq_integer((mp_int *)*puVar3,0), uVar2 == 0)) &&
       (uVar2 = mp_eq_integer((mp_int *)puVar3[1],0), uVar2 == 0)) {
      return (ssh_key *)(puVar3 + 5);
    }
    dsa_freekey((ssh_key *)(puVar3 + 5));
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *dsa_new_pub(const ssh_keyalg *self, ptrlen data)
{
    BinarySource src[1];
    struct dsa_key *dsa;

    BinarySource_BARE_INIT_PL(src, data);
    if (!ptrlen_eq_string(get_string(src), "ssh-dss"))
        return NULL;

    dsa = snew(struct dsa_key);
    dsa->sshk.vt = &ssh_dsa;
    dsa->p = get_mp_ssh2(src);
    dsa->q = get_mp_ssh2(src);
    dsa->g = get_mp_ssh2(src);
    dsa->y = get_mp_ssh2(src);
    dsa->x = NULL;

    if (get_err(src) ||
        mp_eq_integer(dsa->p, 0) || mp_eq_integer(dsa->q, 0)) {
        /* Invalid key. */
        dsa_freekey(&dsa->sshk);
        return NULL;
    }

    return &dsa->sshk;
}